

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O1

ptr __thiscall
agge::tests::mocks::create_font<6ul,6ul>
          (mocks *this,font_metrics *metrics_,char_to_index (*indices) [6],glyph (*glyphs) [6])

{
  real_t rVar1;
  font *__p;
  font_accessor *__p_00;
  unsigned_long *__p_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ptr pVar3;
  allocator_type local_51;
  font *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  accessor_ptr local_40;
  
  local_50 = (font *)operator_new(0x498);
  __p_00 = (font_accessor *)operator_new(0xb0);
  (__p_00->super_accessor)._vptr_accessor = (_func_int **)&PTR_get_descriptor_001bd5d0;
  __p_00->glyph_mapping_calls = 0;
  __p_01 = (unsigned_long *)operator_new(8);
  *__p_01 = 0;
  (__p_00->glyphs_loaded).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p_01;
  local_48 = &(__p_00->glyphs_loaded).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_long*>(local_48,__p_01);
  (__p_00->descriptor).family._M_dataplus._M_p = (pointer)&(__p_00->descriptor).family.field_2;
  (__p_00->descriptor).family._M_string_length = 0;
  (__p_00->descriptor).family.field_2._M_local_buf[0] = '\0';
  rVar1 = metrics_->descent;
  (__p_00->_metrics).ascent = metrics_->ascent;
  (__p_00->_metrics).descent = rVar1;
  (__p_00->_metrics).leading = metrics_->leading;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<agge::tests::mocks::font_accessor::char_to_index_const*>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&__p_00->_indices,*indices,indices[1]);
  std::
  vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
  ::vector<agge::tests::mocks::font_accessor::glyph*,void>
            ((vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
              *)&__p_00->_glyphs,*glyphs,glyphs[1],&local_51);
  (__p_00->_allocated).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p_00->_allocated).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.super___shared_ptr<agge::font::accessor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__p_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<agge::tests::mocks::font_accessor*>
            (&local_40.super___shared_ptr<agge::font::accessor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p_00);
  __p = local_50;
  font::font(local_50,&local_40,1.0);
  *(font **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<agge::font*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var2._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<agge::font::accessor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<agge::font::accessor,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr)pVar3.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline font::ptr create_font(const font_metrics &metrics_,
				const font_accessor::char_to_index (&indices)[indices_n], font_accessor::glyph (&glyphs)[glyphs_n])
			{	return font::ptr(new font(font::accessor_ptr(new font_accessor(metrics_, indices, glyphs))));	}